

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O1

pseudo_t dmrC_alloc_phi(dmr_C *C,basic_block *source,pseudo_t pseudo,symbol *type)

{
  instruction *ptr;
  pseudo_t ppVar1;
  
  if (source == (basic_block *)0x0) {
    ppVar1 = &C->L->void_pseudo;
  }
  else {
    ptr = dmrC_alloc_phisrc(C,pseudo,type);
    ptr->bb = source;
    ptrlist_add((ptr_list **)&source->insns,ptr,&C->ptrlist_allocator);
    ppVar1 = (ptr->field_5).target;
  }
  return ppVar1;
}

Assistant:

pseudo_t dmrC_alloc_phi(struct dmr_C *C, struct basic_block *source, pseudo_t pseudo, struct symbol *type)
{
	struct instruction *insn;

	if (!source)
		return VOID_PSEUDO(C);

	insn = dmrC_alloc_phisrc(C, pseudo, type);
	insn->bb = source;
	dmrC_add_instruction(C, &source->insns, insn);
	return insn->target;
}